

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::negative_horn_satisfiable(Internal *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  reference ppCVar4;
  literal_iterator piVar5;
  int *piVar6;
  Internal *in_RDI;
  int idx;
  iterator __end1_1;
  iterator __begin1_1;
  Range *__range1_1;
  char tmp;
  int *lit;
  literal_iterator __end2;
  literal_iterator __begin2;
  Clause *__range2;
  bool satisfied;
  int negative_literal;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1;
  Internal *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  iterator local_70;
  iterator local_6c;
  Range *local_68;
  char local_59;
  int *local_58;
  int *local_50;
  Internal *this_00;
  int local_34;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_20;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_18;
  
  local_18 = &in_RDI->clauses;
  local_20._M_current =
       (Clause **)
       std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                 ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
            ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar1) {
      local_68 = &in_RDI->vars;
      local_6c = Range::begin((Range *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                             );
      local_70 = Range::end((Range *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while( true ) {
        bVar1 = CaDiCaL::operator!=(&local_6c,&local_70);
        if (!bVar1) {
          if (in_RDI->internal != (Internal *)0x0) {
            verbose(in_RDI->internal,1,"clauses are negative horn satisfied");
          }
          (in_RDI->stats).lucky.horn.negative = (in_RDI->stats).lucky.horn.negative + 1;
          return 10;
        }
        piVar6 = Range::iterator::operator*(&local_6c);
        iVar3 = *piVar6;
        bVar1 = terminated_asynchronously
                          ((Internal *)CONCAT44(iVar3,in_stack_ffffffffffffff88),
                           (int)((ulong)in_RDI >> 0x20));
        if (bVar1) break;
        cVar2 = val(in_RDI,iVar3);
        if (cVar2 == '\0') {
          search_assume_decision(in_RDI,in_stack_ffffffffffffff7c);
          bVar1 = propagate(in_stack_000000b0);
          if (!bVar1) {
            iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
            return iVar3;
          }
        }
        Range::iterator::operator++((iterator *)in_RDI);
      }
      iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
      return iVar3;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              ::operator*(&local_20);
    bVar1 = terminated_asynchronously
                      ((Internal *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (int)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
      return iVar3;
    }
    if (((*(uint *)&(*ppCVar4)->field_0x8 >> 4 & 1) == 0) &&
       ((*(uint *)&(*ppCVar4)->field_0x8 >> 0xb & 1) == 0)) {
      local_34 = 0;
      bVar1 = false;
      this_00 = (Internal *)*ppCVar4;
      piVar5 = Clause::begin((Clause *)this_00);
      local_50 = Clause::end((Clause *)this_00);
      for (; piVar5 != local_50; piVar5 = piVar5 + 1) {
        local_58 = piVar5;
        local_59 = val(in_RDI,*piVar5);
        if ('\0' < local_59) {
          bVar1 = true;
          break;
        }
        if ((-1 < local_59) && (*local_58 < 1)) {
          local_34 = *local_58;
          break;
        }
      }
      if (!bVar1) {
        if (local_34 == 0) {
          if (0 < in_RDI->level) {
            backtrack(this_00,(int)((ulong)piVar5 >> 0x20));
          }
          iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
          return iVar3;
        }
        search_assume_decision(in_RDI,in_stack_ffffffffffffff7c);
        bVar1 = propagate(in_stack_000000b0);
        if (!bVar1) {
          iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
          return iVar3;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

int Internal::negative_horn_satisfiable () {
  LOG ("checking that all clauses are negative horn satisfiable");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    int negative_literal = 0;
    bool satisfied = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit > 0)
        continue;
      negative_literal = lit;
      break;
    }
    if (satisfied)
      continue;
    if (!negative_literal) {
      if (level > 0)
        backtrack ();
      LOG (c, "no negative unassigned literal in");
      return unlucky (0);
    }
    assert (negative_literal < 0);
    LOG (c, "found negative literal %d in", negative_literal);
    search_assume_decision (negative_literal);
    if (propagate ())
      continue;
    LOG ("propagation of negative literal %d leads to conflict",
         negative_literal);
    return unlucky (0);
  }
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    LOG ("propagation of remaining literal %d leads to conflict", idx);
    return unlucky (0);
  }
  VERBOSE (1, "clauses are negative horn satisfied");
  assert (!conflict);
  assert (satisfied ());
  stats.lucky.horn.negative++;
  return 10;
}